

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O2

char * strtoken(char *src,char *dst,int size)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  
  iVar2 = (int)src + -1;
  for (; (cVar1 = *src, cVar1 == '\t' || (cVar1 == ' ')); src = src + 1) {
    iVar2 = iVar2 + 1;
  }
  if ((cVar1 == '\0') || (cVar1 == '\n')) {
    pcVar8 = (char *)0x0;
  }
  else {
    lVar7 = 1;
    uVar4 = 0;
    while ((cVar1 != '\0' && (cVar1 != '\n'))) {
      if (cVar1 == ' ') {
        lVar7 = 1 - uVar4;
        goto LAB_00110729;
      }
      pcVar8 = src + lVar7;
      uVar4 = uVar4 - 1;
      lVar7 = lVar7 + 1;
      cVar1 = *pcVar8;
    }
    lVar7 = -uVar4;
LAB_00110729:
    pcVar8 = src + lVar7;
    for (pcVar5 = src + ~uVar4;
        (uVar4 = uVar4 + 1, pcVar6 = src, uVar4 != 0 &&
        ((*pcVar5 == ' ' || (pcVar6 = pcVar5, *pcVar5 == '\t')))); pcVar5 = pcVar5 + -1) {
    }
    iVar2 = (int)pcVar6 - iVar2;
    iVar3 = size + -1;
    if (iVar2 < size) {
      iVar3 = iVar2;
    }
    if (size < 1) {
      iVar3 = iVar2;
    }
    strncpy(dst,src,(long)iVar3);
    dst[iVar3] = '\0';
  }
  return pcVar8;
}

Assistant:

char *strtoken(char *src, char *dst, int size)
{
    char *p, *st, *ed;
    int  len = 0;

    // l-trim
    p = src;

    while(TRUE)
    {
        if((*p == '\n') || (*p == 0)) return NULL; /* value is not exists */
        if((*p != ' ') && (*p != '\t')) break;
        p++;
    }

    st = p;
    while(TRUE)
    {
        ed = p;
        if(*p == ' ') {
            p++;
            break;
        }
        if((*p == '\n') || (*p == 0)) break;
        p++;
    }

    // r-trim
    while(TRUE)
    {
        ed--;
        if(st == ed) break;
        if((*ed != ' ') && (*ed != '\t')) break;
    }

    len = (int)(ed - st + 1);
    if((size > 0) && (len >= size)) len = size - 1;

    strncpy(dst, st, len);
    dst[len]=0;

    return p;
}